

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  int iVar1;
  int res;
  uint size_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = 0;
  }
  else if (size < buf->size) {
    buf_local._4_4_ = 1;
  }
  else {
    iVar1 = xmlBufferGrow(buf,size - buf->use);
    buf_local._4_4_ = (uint)(-1 < iVar1);
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    int res;

    if (buf == NULL)
        return(0);
    if (size < buf->size)
        return(1);
    res = xmlBufferGrow(buf, size - buf->use);

    return(res < 0 ? 0 : 1);
}